

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O3

int Bac_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  byte bVar1;
  undefined8 *puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  size_t sVar10;
  long lVar11;
  undefined4 *puVar12;
  char *pcVar13;
  uint uVar14;
  long *plVar15;
  uint uVar16;
  ulong uVar17;
  Bac_Ntk_t *p;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 local_40;
  
  puVar2 = (undefined8 *)pAbc->pAbcBac;
  local_40 = 0;
  Extra_UtilGetoptReset();
  bVar3 = false;
  do {
    while (iVar7 = Extra_UtilGetopt(argc,argv,"Mvh"), iVar8 = globalUtilOptind, iVar7 == 0x76) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (iVar7 == -1) {
      if (puVar2 == (undefined8 *)0x0) {
        Abc_Print(1,"Bac_CommandPs(): There is no current design.\n");
        return 0;
      }
      iVar8 = *(int *)(puVar2 + 4);
      uVar14 = 0;
      if (((long)iVar8 < 1) || (*(int *)((long)puVar2 + 0x24) < iVar8)) {
        lVar11 = 0;
      }
      else {
        lVar11 = (long)iVar8 * 0xd0 + puVar2[5];
      }
      printf("%-12s : ",*puVar2);
      printf("pi =%5d  ",(ulong)*(uint *)(lVar11 + 0x24));
      printf("po =%5d  ",(ulong)*(uint *)(lVar11 + 0x34));
      iVar8 = Abc_NamObjNumMax((Abc_Nam_t *)puVar2[3]);
      printf("pri =%4d  ",(ulong)(uint)(iVar8 - *(int *)((long)puVar2 + 0x24)));
      printf("mod =%6d  ",(ulong)*(uint *)((long)puVar2 + 0x24));
      if (0 < (int)*(uint *)((long)puVar2 + 0x24)) {
        uVar14 = 0;
        lVar11 = 1;
        do {
          iVar8 = *(int *)(puVar2[5] + 0x54 + lVar11 * 0xd0);
          iVar7 = 0;
          if (0 < (long)iVar8) {
            lVar18 = 0;
            iVar7 = 0;
            do {
              bVar1 = *(byte *)(*(long *)(lVar11 * 0xd0 + puVar2[5] + 0x58) + lVar18);
              if ((char)bVar1 < '\0') goto LAB_0030ccef;
              iVar7 = iVar7 + (uint)(bVar1 < 10);
              lVar18 = lVar18 + 1;
            } while (iVar8 != lVar18);
          }
          uVar14 = (uVar14 + iVar8) - iVar7;
          lVar11 = lVar11 + 1;
        } while (lVar11 != (ulong)*(uint *)((long)puVar2 + 0x24) + 1);
      }
      uVar16 = 0;
      printf("box =%7d  ",(ulong)uVar14);
      if (0 < (int)*(uint *)((long)puVar2 + 0x24)) {
        lVar11 = 0;
        uVar16 = 0;
        do {
          uVar16 = uVar16 + *(int *)(puVar2[5] + 0x124 + lVar11);
          lVar11 = lVar11 + 0xd0;
        } while ((ulong)*(uint *)((long)puVar2 + 0x24) * 0xd0 - lVar11 != 0);
      }
      printf("obj =%7d  ",(ulong)uVar16);
      if ((char *)*puVar2 == (char *)0x0) {
        iVar8 = 0x530;
      }
      else {
        sVar10 = strlen((char *)*puVar2);
        iVar8 = (int)sVar10 + 0x530;
      }
      if ((char *)puVar2[1] != (char *)0x0) {
        sVar10 = strlen((char *)puVar2[1]);
        iVar8 = iVar8 + (int)sVar10;
      }
      iVar7 = Abc_NamMemUsed((Abc_Nam_t *)puVar2[2]);
      iVar9 = Abc_NamMemUsed((Abc_Nam_t *)puVar2[3]);
      iVar9 = iVar9 + iVar7 + iVar8;
      if (0 < (int)*(uint *)((long)puVar2 + 0x24)) {
        lVar11 = puVar2[5];
        lVar18 = 0;
        do {
          iVar9 = iVar9 + (int)((double)*(int *)(lVar11 + 0x130 + lVar18) * 4.0 + 16.0) +
                          (int)((double)*(int *)(lVar11 + 0x170 + lVar18) * 4.0 + 16.0) +
                          (int)((double)*(int *)(lVar11 + 0x100 + lVar18) * 4.0 + 16.0) +
                          (int)((double)*(int *)(lVar11 + 0x150 + lVar18) * 4.0 + 16.0) +
                          (int)((double)*(int *)(lVar11 + 0x110 + lVar18) * 4.0 + 16.0) +
                          (int)((double)*(int *)(lVar11 + 0x160 + lVar18) * 4.0 + 16.0) +
                          (int)((double)*(int *)(lVar11 + 0xf0 + lVar18) * 4.0 + 16.0) +
                          (int)((double)*(int *)(lVar11 + 0x140 + lVar18) * 4.0 + 16.0) +
                          *(int *)(lVar11 + 0x120 + lVar18) + 0xe0;
          lVar18 = lVar18 + 0xd0;
        } while ((ulong)*(uint *)((long)puVar2 + 0x24) * 0xd0 - lVar18 != 0);
      }
      printf("mem =%6.3f MB",(double)iVar9 * 9.5367431640625e-07);
      putchar(10);
      auVar6 = _DAT_007ee2e0;
      auVar5 = _DAT_007ee2d0;
      auVar4 = _DAT_007ee2c0;
      iVar8 = *(int *)((long)puVar2 + 0x24);
      if (0 < (long)iVar8) {
        lVar11 = (long)iVar8 + -1;
        auVar19._8_4_ = (int)lVar11;
        auVar19._0_8_ = lVar11;
        auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
        puVar12 = (undefined4 *)(puVar2[5] + 0xe8);
        uVar17 = 0;
        auVar19 = auVar19 ^ _DAT_007ee2e0;
        do {
          auVar20._8_4_ = (int)uVar17;
          auVar20._0_8_ = uVar17;
          auVar20._12_4_ = (int)(uVar17 >> 0x20);
          auVar21 = (auVar20 | auVar5) ^ auVar6;
          iVar7 = auVar19._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar7 && auVar19._0_4_ < auVar21._0_4_ ||
                      iVar7 < auVar21._4_4_) & 1)) {
            *puVar12 = 0xffffffff;
          }
          if ((auVar21._12_4_ != auVar19._12_4_ || auVar21._8_4_ <= auVar19._8_4_) &&
              auVar21._12_4_ <= auVar19._12_4_) {
            puVar12[0x34] = 0xffffffff;
          }
          auVar20 = (auVar20 | auVar4) ^ auVar6;
          iVar9 = auVar20._4_4_;
          if (iVar9 <= iVar7 && (iVar9 != iVar7 || auVar20._0_4_ <= auVar19._0_4_)) {
            puVar12[0x68] = 0xffffffff;
            puVar12[0x9c] = 0xffffffff;
          }
          uVar17 = uVar17 + 4;
          puVar12 = puVar12 + 0xd0;
        } while ((iVar8 + 3U & 0xfffffffc) != uVar17);
      }
      uVar14 = *(uint *)(puVar2 + 4);
      if (iVar8 < (int)uVar14 || (int)uVar14 < 1) {
        p = (Bac_Ntk_t *)0x0;
      }
      else {
        p = (Bac_Ntk_t *)((ulong)uVar14 * 0xd0 + puVar2[5]);
      }
      Bac_ManBoxNum_rec(p);
      if (*(int *)((long)puVar2 + 0x24) < 1) {
        return 0;
      }
      uVar17 = 1;
      do {
        if (uVar17 == (int)local_40 + 1) {
          return 0;
        }
        plVar15 = (long *)(uVar17 * 0xd0 + puVar2[5]);
        iVar7 = 0;
        printf("Module %5d : ",uVar17 & 0xffffffff);
        printf("pi =%5d  ",(ulong)*(uint *)((long)plVar15 + 0x24));
        printf("pi =%5d  ",(ulong)*(uint *)((long)plVar15 + 0x34));
        iVar8 = *(int *)((long)plVar15 + 0x54);
        if (0 < (long)iVar8) {
          lVar11 = 0;
          iVar7 = 0;
          do {
            if ((char)*(byte *)(plVar15[0xb] + lVar11) < '\0') {
LAB_0030ccef:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10c,"int Abc_Lit2Var(int)");
            }
            iVar7 = iVar7 + (uint)(*(byte *)(plVar15[0xb] + lVar11) < 10);
            lVar11 = lVar11 + 1;
          } while (iVar8 != lVar11);
        }
        printf("box =%6d  ",(ulong)(uint)(iVar8 - iVar7));
        printf("clp =%7d  ",(ulong)*(uint *)(plVar15 + 3));
        printf("obj =%7d  ",(ulong)*(uint *)((long)plVar15 + 0x54));
        pcVar13 = Abc_NamStr(*(Abc_Nam_t **)(*plVar15 + 0x10),(int)plVar15[1]);
        printf("%s ",pcVar13);
        iVar8 = (int)plVar15[2];
        if ((0 < (long)iVar8) && (iVar8 <= *(int *)(*plVar15 + 0x24))) {
          lVar11 = *(long *)(*plVar15 + 0x28);
          lVar18 = (long)iVar8 * 0xd0;
          pcVar13 = Abc_NamStr(*(Abc_Nam_t **)(*(long *)(lVar11 + lVar18) + 0x10),
                               *(int *)(lVar11 + 8 + lVar18));
          printf("-> %s",pcVar13);
        }
        putchar(10);
        bVar3 = (long)*(int *)((long)puVar2 + 0x24) <= (long)uVar17;
        uVar17 = uVar17 + 1;
        if (bVar3) {
          return 0;
        }
      } while( true );
    }
    if (iVar7 != 0x4d) goto LAB_0030cc5e;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
      goto LAB_0030cc5e;
    }
    iVar7 = atoi(argv[globalUtilOptind]);
    local_40 = CONCAT44(extraout_var,iVar7);
    globalUtilOptind = iVar8 + 1;
    if (iVar7 < 0) {
LAB_0030cc5e:
      Abc_Print(-2,"usage: @_ps [-M num] [-vh]\n");
      Abc_Print(-2,"\t         prints statistics\n");
      Abc_Print(-2,"\t-M num : the number of first modules to report [default = %d]\n",local_40);
      pcVar13 = "yes";
      if (!bVar3) {
        pcVar13 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar13);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Bac_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * p = Bac_AbcGetMan(pAbc);
    int c, nModules = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Mvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nModules = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nModules < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandPs(): There is no current design.\n" );
        return 0;
    }
    Bac_ManPrintStats( p, nModules, fVerbose );
    return 0;
usage:
    Abc_Print( -2, "usage: @_ps [-M num] [-vh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-M num : the number of first modules to report [default = %d]\n", nModules );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}